

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geometry.cpp
# Opt level: O3

int rply_vertex_callback_vec2(p_ply_argument argument)

{
  double dVar1;
  long index;
  float *buffer;
  long local_28;
  void *local_20;
  
  ply_get_argument_user_data(argument,&local_20,(long *)0x0);
  ply_get_argument_element(argument,(p_ply_element *)0x0,&local_28);
  dVar1 = ply_get_argument_value(argument);
  *(float *)((long)local_20 + local_28 * 8) = (float)dVar1;
  return 1;
}

Assistant:

static int rply_vertex_callback_vec2(p_ply_argument argument) {
    float* buffer;
    ply_get_argument_user_data(argument, (void**)&buffer, nullptr);

    long index;
    ply_get_argument_element(argument, nullptr, &index);

    float value = (float)ply_get_argument_value(argument);
    buffer[index * 2] = value;
    return 1;
}